

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_changeColsIntegralityByRange
                   (void *highs,HighsInt from_col,HighsInt to_col,HighsInt *integrality)

{
  HighsStatus HVar1;
  ulong uVar2;
  uint uVar3;
  vector<HighsVarType,_std::allocator<HighsVarType>_> pass_integrality;
  _Vector_base<HighsVarType,_std::allocator<HighsVarType>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (HighsVarType *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = to_col - from_col;
  if (-1 < (int)uVar3) {
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
              ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)&local_48,(ulong)(uVar3 + 1));
    for (uVar2 = 0; uVar2 <= uVar3; uVar2 = uVar2 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start[uVar2] =
           *(HighsVarType *)(integrality + uVar2);
    }
  }
  HVar1 = Highs::changeColsIntegrality
                    ((Highs *)highs,from_col,to_col,
                     local_48._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<HighsVarType,_std::allocator<HighsVarType>_>::~_Vector_base(&local_48);
  return HVar1;
}

Assistant:

HighsInt Highs_changeColsIntegralityByRange(void* highs,
                                            const HighsInt from_col,
                                            const HighsInt to_col,
                                            const HighsInt* integrality) {
  vector<HighsVarType> pass_integrality;
  HighsInt num_ix = to_col - from_col + 1;
  if (num_ix > 0) {
    pass_integrality.resize(num_ix);
    for (HighsInt ix = 0; ix < num_ix; ix++) {
      pass_integrality[ix] = (HighsVarType)integrality[ix];
    }
  }
  return (HighsInt)((Highs*)highs)
      ->changeColsIntegrality(from_col, to_col, pass_integrality.data());
}